

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O0

WOPNFile * WOPN_Init(uint16_t melodic_banks,uint16_t percussive_banks)

{
  uint16_t uVar1;
  WOPNBank *pWVar2;
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  WOPNFile *file;
  uint16_t percussive_banks_local;
  WOPNFile *pWStack_10;
  uint16_t melodic_banks_local;
  
  pWStack_10 = (WOPNFile *)calloc(1,0x20);
  if (pWStack_10 == (WOPNFile *)0x0) {
    pWStack_10 = (WOPNFile *)0x0;
  }
  else {
    uVar1 = melodic_banks;
    if (melodic_banks == 0) {
      uVar1 = 1;
    }
    pWStack_10->banks_count_melodic = uVar1;
    pWVar2 = (WOPNBank *)calloc((ulong)pWStack_10->banks_count_melodic,0x2424);
    pWStack_10->banks_melodic = pWVar2;
    if (melodic_banks == 0) {
      for (local_24 = 0; local_24 < 0x80; local_24 = local_24 + 1) {
        pWStack_10->banks_melodic->ins[local_24].inst_flags = '\x02';
      }
    }
    uVar1 = percussive_banks;
    if (percussive_banks == 0) {
      uVar1 = 1;
    }
    pWStack_10->banks_count_percussion = uVar1;
    pWVar2 = (WOPNBank *)calloc((ulong)pWStack_10->banks_count_percussion,0x2424);
    pWStack_10->banks_percussive = pWVar2;
    if (percussive_banks == 0) {
      for (local_28 = 0; local_28 < 0x80; local_28 = local_28 + 1) {
        pWStack_10->banks_percussive->ins[local_28].inst_flags = '\x02';
      }
    }
  }
  return pWStack_10;
}

Assistant:

WOPNFile *WOPN_Init(uint16_t melodic_banks, uint16_t percussive_banks)
{
    WOPNFile *file = (WOPNFile*)calloc(1, sizeof(WOPNFile));
    if(!file)
        return NULL;

    file->banks_count_melodic = (melodic_banks != 0) ? melodic_banks : 1;
    file->banks_melodic = (WOPNBank*)calloc(file->banks_count_melodic, sizeof(WOPNBank));

    if(melodic_banks == 0)
    {
        unsigned i;
        for(i = 0; i < 128; ++i)
            file->banks_melodic[0].ins[i].inst_flags = WOPN_Ins_IsBlank;
    }

    file->banks_count_percussion = (percussive_banks != 0) ? percussive_banks : 1;
    file->banks_percussive = (WOPNBank*)calloc(file->banks_count_percussion, sizeof(WOPNBank));

    if(percussive_banks == 0)
    {
        unsigned i;
        for(i = 0; i < 128; ++i)
            file->banks_percussive[0].ins[i].inst_flags = WOPN_Ins_IsBlank;
    }

    return file;
}